

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::~cmComputeLinkDepends(cmComputeLinkDepends *this)

{
  cmComputeLinkDepends *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->ObjectEntries);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set(&this->OldWrongConfigItems);
  std::vector<int,_std::allocator<int>_>::~vector(&this->OriginalEntries);
  std::vector<int,_std::allocator<int>_>::~vector(&this->FinalLinkOrder);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr(&this->CCG);
  std::
  map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::~map(&this->PendingComponents);
  std::vector<int,_std::allocator<int>_>::~vector(&this->ComponentOrder);
  std::vector<char,_std::allocator<char>_>::~vector(&this->ComponentVisited);
  cmGraphAdjacencyList::~cmGraphAdjacencyList(&this->EntryConstraintGraph);
  std::
  vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ::~vector(&this->InferredDependSets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->SharedDepFollowed);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
  ::~queue(&this->SharedDepQueue);
  std::
  queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
  ::~queue(&this->BFSQueue);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map(&this->GroupItems);
  std::
  map<cmLinkItem,_int,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>::
  ~map(&this->LinkEntryIndex);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->EntryList);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->LinkLibraryOverride);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  ~vector(&this->FinalLinkEntries);
  std::__cxx11::string::~string((string *)&this->Config);
  std::__cxx11::string::~string((string *)&this->LinkLanguage);
  return;
}

Assistant:

cmComputeLinkDepends::~cmComputeLinkDepends() = default;